

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

TypedExpectation<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
* __thiscall
testing::internal::
MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>::
InternalExpectedAt(MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
                   *this,char *file,int line,char *obj,char *call)

{
  UntypedFunctionMockerBase *this_00;
  Sequence *this_01;
  void *mock_obj;
  TypedExpectation<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  *this_02;
  Sequence **ppSVar1;
  int line_00;
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string source_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_68,"EXPECT_CALL(",&local_c9);
  std::operator+(&local_48,&local_68,"arch");
  std::operator+(&local_a8,&local_48,", ");
  std::operator+(&local_c8,&local_a8,"readn (_)");
  std::operator+(&source_text,&local_c8,")");
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::operator+(&local_c8,&source_text," invoked");
  line_00 = (int)file;
  LogWithLocation(kInfo,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                  ,line_00,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  this_00 = &this->function_mocker_->super_UntypedFunctionMockerBase;
  mock_obj = UntypedFunctionMockerBase::MockObject(this_00);
  Mock::RegisterUseByOnCallOrExpectCall
            (mock_obj,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
             ,line_00);
  this_02 = (TypedExpectation<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
             *)operator_new(0x140);
  ExpectationBase::ExpectationBase
            ((ExpectationBase *)this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
             ,line_00,&source_text);
  (this_02->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_001877c8;
  this_02->owner_ =
       (FunctionMocker<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
        *)this_00;
  Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>_>::Matcher
            ((Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
              *)&this_02->matchers_,
             (Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
              *)&this->matchers_);
  (this_02->extra_matcher_).
  super_MatcherBase<const_std::tuple<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>_&>
  .vtable_ = (VTable *)
             MatcherBase<std::tuple<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>>const&>
             ::
             GetVTable<testing::internal::MatcherBase<std::tuple<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
             ::kVTable;
  (this_02->extra_matcher_).
  super_MatcherBase<const_std::tuple<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>_&>
  .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00187660;
  *(undefined8 *)&(this_02->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this_02->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this_02->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this_02->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  local_c8._M_dataplus._M_p = (pointer)this_02;
  local_c8._M_string_length = (size_type)operator_new(0x18);
  *(undefined8 *)(local_c8._M_string_length + 8) = 0x100000001;
  *(undefined ***)local_c8._M_string_length = &PTR___Sp_counted_base_00187810;
  *(TypedExpectation<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
    **)(local_c8._M_string_length + 0x10) = this_02;
  std::
  vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ::push_back(&this_00->untyped_expectations_,(value_type *)&local_c8);
  ppSVar1 = ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                      ((ThreadLocal<testing::Sequence_*> *)g_gmock_implicit_sequence);
  this_01 = *ppSVar1;
  if (this_01 != (Sequence *)0x0) {
    Expectation::Expectation
              ((Expectation *)&local_a8,(shared_ptr<testing::internal::ExpectationBase> *)&local_c8)
    ;
    Sequence::AddExpectation(this_01,(Expectation *)&local_a8);
    Expectation::~Expectation((Expectation *)&local_a8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length);
  std::__cxx11::string::~string((string *)&source_text);
  return this_02;
}

Assistant:

internal::TypedExpectation<F>& InternalExpectedAt(
      const char* file, int line, const char* obj, const char* call) {
    const std::string source_text(std::string("EXPECT_CALL(") + obj + ", " +
                                  call + ")");
    LogWithLocation(internal::kInfo, file, line, source_text + " invoked");
    return function_mocker_->AddNewExpectation(
        file, line, source_text, matchers_);
  }